

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O0

void __thiscall QMainWindowLayout::removeToolBarBreak(QMainWindowLayout *this,QToolBar *before)

{
  bool bVar1;
  QToolBar *in_RDI;
  QToolBarAreaLayout *unaff_retaddr;
  QToolBar *before_00;
  
  before_00 = in_RDI;
  QToolBarAreaLayout::removeToolBarBreak(unaff_retaddr,in_RDI);
  bVar1 = QMainWindowLayoutState::isValid((QMainWindowLayoutState *)0x5f5f90);
  if (bVar1) {
    QToolBarAreaLayout::removeToolBarBreak(unaff_retaddr,before_00);
  }
  (**(code **)(*(long *)&in_RDI->super_QWidget + 0x70))();
  return;
}

Assistant:

void QMainWindowLayout::removeToolBarBreak(QToolBar *before)
{
    layoutState.toolBarAreaLayout.removeToolBarBreak(before);
    if (savedState.isValid())
        savedState.toolBarAreaLayout.removeToolBarBreak(before);
    invalidate();
}